

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ConditionalExpressionSyntax::setChild
          (ConditionalExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  logic_error *this_00;
  Token TVar3;
  ExpressionSyntax *local_178;
  ExpressionSyntax *local_170;
  ConditionalPredicateSyntax *local_168;
  string local_140;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  ExpressionSyntax *local_68;
  ExpressionSyntax *local_60;
  undefined8 local_58;
  Info *local_50;
  ExpressionSyntax *local_48;
  ExpressionSyntax *local_40;
  undefined8 local_38;
  Info *local_30;
  ConditionalPredicateSyntax *local_28;
  ConditionalPredicateSyntax *local_20;
  size_t local_18;
  size_t index_local;
  ConditionalExpressionSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_168 = (ConditionalPredicateSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_168 = SyntaxNode::as<slang::syntax::ConditionalPredicateSyntax>(pSVar2);
    }
    local_28 = local_168;
    not_null<slang::syntax::ConditionalPredicateSyntax*>::
    not_null<slang::syntax::ConditionalPredicateSyntax*,void>
              ((not_null<slang::syntax::ConditionalPredicateSyntax*> *)&local_20,&local_28);
    (this->predicate).ptr = local_20;
    break;
  case 1:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar3._0_8_;
    (this->question).kind = (undefined2)local_38;
    (this->question).field_0x2 = local_38._2_1_;
    (this->question).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->question).rawLen = local_38._4_4_;
    local_30 = TVar3.info;
    (this->question).info = local_30;
    break;
  case 2:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar2);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=(&this->attributes,pSVar1);
    break;
  case 3:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_170 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_170 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar2);
    }
    local_48 = local_170;
    not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
              ((not_null<slang::syntax::ExpressionSyntax*> *)&local_40,&local_48);
    (this->left).ptr = local_40;
    break;
  case 4:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar3._0_8_;
    (this->colon).kind = (undefined2)local_58;
    (this->colon).field_0x2 = local_58._2_1_;
    (this->colon).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->colon).rawLen = local_58._4_4_;
    local_50 = TVar3.info;
    (this->colon).info = local_50;
    break;
  case 5:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_178 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_178 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar2);
    }
    local_68 = local_178;
    not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
              ((not_null<slang::syntax::ExpressionSyntax*> *)&local_60,&local_68);
    (this->right).ptr = local_60;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_109);
    std::operator+(&local_e8,&local_108,":");
    std::__cxx11::to_string(&local_140,0xa45);
    std::operator+(&local_c8,&local_e8,&local_140);
    std::operator+(&local_a8,&local_c8,": ");
    std::operator+(&local_88,&local_a8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_88);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void ConditionalExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: predicate = child.node() ? &child.node()->as<ConditionalPredicateSyntax>() : nullptr; return;
        case 1: question = child.token(); return;
        case 2: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 3: left = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 4: colon = child.token(); return;
        case 5: right = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}